

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O2

void message_destroy(MESSAGE_HANDLE message)

{
  void *__ptr;
  AMQP_VALUE value;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  BODY_AMQP_DATA *__ptr_00;
  size_t i;
  long lVar1;
  ulong uVar2;
  
  if (message != (MESSAGE_HANDLE)0x0) {
    if (message->header != (HEADER_HANDLE)0x0) {
      header_destroy(message->header);
    }
    if (message->delivery_annotations != (AMQP_VALUE)0x0) {
      amqpvalue_destroy(message->delivery_annotations);
    }
    if (message->message_annotations != (AMQP_VALUE)0x0) {
      amqpvalue_destroy(message->message_annotations);
    }
    if (message->properties != (PROPERTIES_HANDLE)0x0) {
      properties_destroy(message->properties);
    }
    if (message->application_properties != (AMQP_VALUE)0x0) {
      amqpvalue_destroy(message->application_properties);
    }
    if (message->footer != (AMQP_VALUE)0x0) {
      amqpvalue_destroy(message->footer);
    }
    if (message->body_amqp_value != (AMQP_VALUE)0x0) {
      amqpvalue_destroy(message->body_amqp_value);
    }
    __ptr_00 = message->body_amqp_data_items;
    lVar1 = 0;
    for (uVar2 = 0; uVar2 < message->body_amqp_data_count; uVar2 = uVar2 + 1) {
      __ptr = *(void **)((long)&__ptr_00->body_data_section_bytes + lVar1);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        __ptr_00 = message->body_amqp_data_items;
        *(undefined8 *)((long)&__ptr_00->body_data_section_bytes + lVar1) = 0;
      }
      lVar1 = lVar1 + 0x10;
    }
    free(__ptr_00);
    message->body_amqp_data_items = (BODY_AMQP_DATA *)0x0;
    message->body_amqp_data_count = 0;
    for (uVar2 = 0; uVar2 < message->body_amqp_sequence_count; uVar2 = uVar2 + 1) {
      value = message->body_amqp_sequence_items[uVar2];
      if (value != (AMQP_VALUE)0x0) {
        amqpvalue_destroy(value);
      }
    }
    free(message->body_amqp_sequence_items);
    free(message);
    return;
  }
  UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
  if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
    (*UNRECOVERED_JUMPTABLE)
              (AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
               ,"message_destroy",0x164,1,"NULL message");
    return;
  }
  return;
}

Assistant:

void message_destroy(MESSAGE_HANDLE message)
{
    if (message == NULL)
    {
        /* Codes_SRS_MESSAGE_01_014: [ If `message` is NULL, `message_destroy` shall do nothing. ]*/
        LogError("NULL message");
    }
    else
    {
        /* Codes_SRS_MESSAGE_01_013: [ `message_destroy` shall free all resources allocated by the message instance identified by the `message` argument. ]*/
        if (message->header != NULL)
        {
            /* Codes_SRS_MESSAGE_01_015: [ The message header shall be freed by calling `header_destroy`. ]*/
            header_destroy(message->header);
        }

        if (message->delivery_annotations != NULL)
        {
            /* Codes_SRS_MESSAGE_01_016: [ The delivery annotations shall be freed by calling `annotations_destroy`. ]*/
            annotations_destroy(message->delivery_annotations);
        }

        if (message->message_annotations != NULL)
        {
            /* Codes_SRS_MESSAGE_01_017: [ The message annotations shall be freed by calling `annotations_destroy`. ]*/
            annotations_destroy(message->message_annotations);
        }

        if (message->properties != NULL)
        {
            /* Codes_SRS_MESSAGE_01_018: [ The message properties shall be freed by calling `properties_destroy`. ]*/
            properties_destroy(message->properties);
        }

        if (message->application_properties != NULL)
        {
            /* Codes_SRS_MESSAGE_01_019: [ The application properties shall be freed by calling `amqpvalue_destroy`. ]*/
            application_properties_destroy(message->application_properties);
        }

        if (message->footer != NULL)
        {
            /* Codes_SRS_MESSAGE_01_020: [ The message footer shall be freed by calling `annotations_destroy`. ]*/
            annotations_destroy(message->footer);
        }

        if (message->body_amqp_value != NULL)
        {
            /* Codes_SRS_MESSAGE_01_021: [ If the message body is made of an AMQP value, the value shall be freed by calling `amqpvalue_destroy`. ]*/
            amqpvalue_destroy(message->body_amqp_value);
        }

        /* Codes_SRS_MESSAGE_01_136: [ If the message body is made of several AMQP data items, they shall all be freed. ]*/
        free_all_body_data_items(message);

        /* Codes_SRS_MESSAGE_01_136: [ If the message body is made of several AMQP sequences, they shall all be freed. ]*/
        free_all_body_sequence_items(message);
        free(message);
    }
}